

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

bool __thiscall
tinyusdz::Animatable<std::vector<float,_std::allocator<float>_>_>::get_scalar
          (Animatable<std::vector<float,_std::allocator<float>_>_> *this,
          vector<float,_std::allocator<float>_> *v)

{
  bool bVar1;
  vector<float,_std::allocator<float>_> *v_local;
  Animatable<std::vector<float,_std::allocator<float>_>_> *this_local;
  
  if (v == (vector<float,_std::allocator<float>_> *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    bVar1 = is_blocked(this);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      bVar1 = has_value(this);
      if (bVar1) {
        std::vector<float,_std::allocator<float>_>::operator=(v,&this->_value);
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool get_scalar(T *v) const {
    if (!v) {
      return false;
    }

    if (is_blocked()) {
      return false;
    } else if (has_value()) {
      (*v) = _value;
      return true;
    }

    // timesamples
    return false;
  }